

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * MulAsgn_VS(Vector *V,double S)

{
  Real *pRVar1;
  Real *pRVar2;
  LASErrIdType LVar3;
  char *Object1Name;
  Real *VCmp;
  size_t Ind;
  size_t Dim;
  Vector *VRes;
  double S_local;
  Vector *V_local;
  
  V_Lock(V);
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    if (V->Instance == Normal) {
      pRVar1 = (Real *)V->Dim;
      pRVar2 = V->Cmp;
      for (VCmp = (Real *)0x1; Dim = (size_t)V, VCmp <= pRVar1; VCmp = (Real *)((long)VCmp + 1)) {
        pRVar2[(long)VCmp] = S * pRVar2[(long)VCmp];
      }
    }
    else {
      Object1Name = V_GetName(V);
      LASError(LASLValErr,"MulAsgn_VS",Object1Name,(char *)0x0,(char *)0x0);
      Dim = 0;
    }
  }
  else {
    Dim = 0;
  }
  V_Unlock(V);
  return (Vector *)Dim;
}

Assistant:

Vector *MulAsgn_VS(Vector *V, double S)
/* VRes = V *= S */
{
    Vector *VRes;

    size_t Dim, Ind;
    Real *VCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (V->Instance == Normal) {
            Dim = V->Dim;
            VCmp = V->Cmp;
            for_AllCmp
                VCmp[Ind] *= S;
            VRes = V;
        } else {
            LASError(LASLValErr, "MulAsgn_VS", V_GetName(V), NULL, NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}